

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

uint32_t raplcap_get_num_die(raplcap *rc,uint32_t pkg)

{
  int iVar1;
  undefined8 in_RAX;
  raplcap *prVar2;
  uint32_t uVar3;
  raplcap_msr_sys_ctx *ctx;
  uint32_t n_pkg;
  uint32_t n_die;
  undefined8 local_18;
  
  prVar2 = &rc_default;
  if (rc != (raplcap *)0x0) {
    prVar2 = rc;
  }
  if (prVar2->state == (void *)0x0) {
    ctx = (raplcap_msr_sys_ctx *)0x0;
  }
  else {
    ctx = *(raplcap_msr_sys_ctx **)((long)prVar2->state + 0x38);
  }
  local_18 = in_RAX;
  iVar1 = msr_sys_get_num_pkg_die(ctx,(uint32_t *)&local_18,(uint32_t *)((long)&local_18 + 4));
  uVar3 = 0;
  if (iVar1 == 0) {
    if (pkg < (uint)local_18) {
      uVar3 = local_18._4_4_;
    }
    else {
      raplcap_get_num_die_cold_1();
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

uint32_t raplcap_get_num_die(const raplcap* rc, uint32_t pkg) {
  const raplcap_msr* state;
  const raplcap_msr_sys_ctx* sys;
  uint32_t n_pkg;
  uint32_t n_die;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    sys = state->sys;
  } else {
    sys = NULL;
  }
  if (msr_sys_get_num_pkg_die(sys, &n_pkg, &n_die)) {
    return 0;
  }
  if (pkg >= n_pkg) {
    raplcap_log(ERROR, "Package %"PRIu32" not in range [0, %"PRIu32")\n", pkg, n_pkg);
    errno = EINVAL;
    return 0;
  }
  return n_die;
}